

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFMFileReader.cpp
# Opt level: O2

EStatusCode __thiscall PFMFileReader::ReadExtension(PFMFileReader *this)

{
  ReadWord(this,&(this->Extension).SizeFields);
  ReadDWord(this,&(this->Extension).ExtMetricsOffset);
  ReadDWord(this,&(this->Extension).ExtentTable);
  ReadDWord(this,&(this->Extension).OriginTable);
  ReadDWord(this,&(this->Extension).PairKernTable);
  ReadDWord(this,&(this->Extension).TrackKernTable);
  ReadDWord(this,&(this->Extension).DriverInfo);
  ReadDWord(this,&(this->Extension).Reserved);
  return this->mInternalReadStatus;
}

Assistant:

EStatusCode PFMFileReader::ReadExtension()
{
	ReadWord(Extension.SizeFields);
	ReadDWord(Extension.ExtMetricsOffset);
	ReadDWord(Extension.ExtentTable);
	ReadDWord(Extension.OriginTable);
	ReadDWord(Extension.PairKernTable);
	ReadDWord(Extension.TrackKernTable);
	ReadDWord(Extension.DriverInfo);
	ReadDWord(Extension.Reserved);

	return mInternalReadStatus;
}